

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

int __thiscall
QProxyStyle::styleHint
          (QProxyStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  int iVar2;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  iVar2 = (**(code **)(*(long *)pQVar1 + 0xf0))(pQVar1,hint,option,widget,returnData);
  return iVar2;
}

Assistant:

int QProxyStyle::styleHint(StyleHint hint, const QStyleOption *option, const QWidget *widget, QStyleHintReturn *returnData) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->styleHint(hint, option, widget, returnData);
}